

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O1

void player_regen_hp(player *p)

{
  short sVar1;
  ushort uVar2;
  int16_t *piVar3;
  _Bool _Var4;
  wchar_t wVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  
  wVar5 = (wchar_t)p->timed[10];
  iVar6 = 0xc5;
  if (((wVar5 < PY_FOOD_WEAK) && (iVar6 = 0x62, wVar5 < PY_FOOD_FAINT)) &&
     (iVar6 = 0x21, wVar5 < PY_FOOD_STARVE)) {
    iVar6 = 0;
  }
  sVar1 = p->chp;
  uVar2 = z_info->food_value;
  _Var4 = player_of_has(p,L'\f');
  iVar6 = (((wVar5 / (int)(uint)uVar2) / 3 + 100) * iVar6) / 100 << _Var4;
  bVar8 = true;
  if (player_turns_rested < L'\x05') {
    bVar8 = (~p->upkeep->resting & 0xfffcU) == 0;
  }
  _Var4 = flag_has_dbg((p->state).pflags,10,0x4c,"p->state.pflags","(PF_REGENERATION)");
  iVar7 = (iVar6 << bVar8) << _Var4;
  _Var4 = player_of_has(p,L'\x1a');
  iVar6 = iVar7 - (iVar6 >> 0x1f) >> 1;
  if (!_Var4) {
    iVar6 = iVar7;
  }
  piVar3 = p->timed;
  iVar7 = 0;
  if ((piVar3[9] == 0 && piVar3[8] == 0) && (piVar3[7] == 0 && piVar3[3] == 0)) {
    iVar7 = iVar6;
  }
  player_adjust_hp_precise(p,p->mhp * iVar7 + 0x5a2);
  if (sVar1 == p->chp) {
    return;
  }
  equip_learn_flag(p,L'\f');
  equip_learn_flag(p,L'\x1a');
  return;
}

Assistant:

void player_regen_hp(struct player *p)
{
	int32_t hp_gain;
	int percent = 0;/* max 32k -> 50% of mhp; more accurately "pertwobytes" */
	int fed_pct, old_chp = p->chp;

	/* Default regeneration */
	if (p->timed[TMD_FOOD] >= PY_FOOD_WEAK) {
		percent = PY_REGEN_NORMAL;
	} else if (p->timed[TMD_FOOD] >= PY_FOOD_FAINT) {
		percent = PY_REGEN_WEAK;
	} else if (p->timed[TMD_FOOD] >= PY_FOOD_STARVE) {
		percent = PY_REGEN_FAINT;
	}

	/* Food bonus - better fed players regenerate up to 1/3 faster */
	fed_pct = p->timed[TMD_FOOD] / z_info->food_value;
	percent *= 100 + fed_pct / 3;
	percent /= 100;

	/* Various things speed up regeneration */
	if (player_of_has(p, OF_REGEN))
		percent *= 2;
	if (player_resting_can_regenerate(p))
		percent *= 2;
	if (player_has(p, PF_REGENERATION))
		percent *= 2;

	/* Some things slow it down */
	if (player_of_has(p, OF_IMPAIR_HP))
		percent /= 2;

	/* Various things interfere with physical healing */
	if (p->timed[TMD_PARALYZED]) percent = 0;
	if (p->timed[TMD_POISONED]) percent = 0;
	if (p->timed[TMD_STUN]) percent = 0;
	if (p->timed[TMD_CUT]) percent = 0;

	/* Extract the new hitpoints */
	hp_gain = (int32_t)(p->mhp * percent) + PY_REGEN_HPBASE;
	player_adjust_hp_precise(p, hp_gain);

	/* Notice changes */
	if (old_chp != p->chp) {
		equip_learn_flag(p, OF_REGEN);
		equip_learn_flag(p, OF_IMPAIR_HP);
	}
}